

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedBase85TTF
          (ImFontAtlas *this,char *compressed_ttf_data_base85,float size_pixels,
          ImFontConfig *font_cfg,ImWchar *glyph_ranges)

{
  int compressed_ttf_size_00;
  size_t sVar1;
  uchar *dst;
  ImFont *pIVar2;
  ImFont *font;
  void *compressed_ttf;
  int compressed_ttf_size;
  ImWchar *glyph_ranges_local;
  ImFontConfig *font_cfg_local;
  float size_pixels_local;
  char *compressed_ttf_data_base85_local;
  ImFontAtlas *this_local;
  
  sVar1 = strlen(compressed_ttf_data_base85);
  compressed_ttf_size_00 = ((int)sVar1 + 4) / 5 << 2;
  dst = (uchar *)ImGui::MemAlloc((long)compressed_ttf_size_00);
  Decode85((uchar *)compressed_ttf_data_base85,dst);
  pIVar2 = AddFontFromMemoryCompressedTTF
                     (this,dst,compressed_ttf_size_00,size_pixels,font_cfg,glyph_ranges);
  ImGui::MemFree(dst);
  return pIVar2;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedBase85TTF(const char* compressed_ttf_data_base85, float size_pixels, const ImFontConfig* font_cfg, const ImWchar* glyph_ranges)
{
    int compressed_ttf_size = (((int)strlen(compressed_ttf_data_base85) + 4) / 5) * 4;
    void* compressed_ttf = ImGui::MemAlloc((size_t)compressed_ttf_size);
    Decode85((const unsigned char*)compressed_ttf_data_base85, (unsigned char*)compressed_ttf);
    ImFont* font = AddFontFromMemoryCompressedTTF(compressed_ttf, compressed_ttf_size, size_pixels, font_cfg, glyph_ranges);
    ImGui::MemFree(compressed_ttf);
    return font;
}